

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::
     ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *enum_handler,
               Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
               *result,string *warn,string *err)

{
  storage_t<double> t;
  bool bVar1;
  bool bVar2;
  Variability VVar3;
  ostream *poVar4;
  PrimVar *pPVar5;
  value_type *pvVar6;
  string *psVar7;
  value_type *pvVar8;
  storage_t<double> *psVar9;
  value_type *pvVar10;
  string *psVar11;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
  *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e40 [32];
  undefined1 local_1e20 [40];
  string local_1df8 [32];
  string local_1dd8;
  ostringstream local_1db8 [8];
  ostringstream ss_e_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c20 [39];
  allocator local_1bf9;
  string local_1bf8 [32];
  string local_1bd8;
  ostringstream local_1bb8 [8];
  ostringstream ss_w_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a20 [39];
  allocator local_19f9;
  string local_19f8 [32];
  string local_19d8;
  ostringstream local_19b8 [8];
  ostringstream ss_e_9;
  undefined1 local_1840 [8];
  expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_2;
  undefined1 local_17f0 [8];
  optional<tinyusdz::Token> tok_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17a8 [39];
  allocator local_1781;
  string local_1780 [32];
  fmt local_1760 [32];
  ostringstream local_1740 [8];
  ostringstream ss_e_8;
  undefined1 local_15c4 [2];
  optional<bool> local_15c2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c0 [6];
  optional<bool> pv_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a0 [39];
  allocator local_1579;
  string local_1578 [32];
  fmt local_1558 [32];
  ostringstream local_1538 [8];
  ostringstream ss_e_7;
  optional<double> local_13c0;
  undefined1 local_13b0 [8];
  optional<double> pv;
  double sample_time;
  size_t i;
  size_t n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1368 [32];
  string local_1348;
  allocator local_1321;
  string local_1320 [32];
  string local_1300;
  ostringstream local_12e0 [8];
  ostringstream ss_e_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148 [39];
  allocator local_1121;
  string local_1120 [32];
  string local_1100;
  ostringstream local_10e0 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f48 [39];
  allocator local_f21;
  string local_f20 [32];
  string local_f00;
  ostringstream local_ee0 [8];
  ostringstream ss_e_5;
  undefined1 local_d68 [8];
  expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_1;
  undefined1 local_d18 [8];
  optional<tinyusdz::Token> tok_1;
  Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> animatable_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc0 [6];
  bool has_timesamples;
  bool has_default;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0 [32];
  string local_c80;
  allocator local_c59;
  string local_c58 [32];
  string local_c38;
  ostringstream local_c18 [8];
  ostringstream ss_e_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80 [39];
  allocator local_a59;
  string local_a58 [32];
  string local_a38;
  ostringstream local_a18 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880 [39];
  allocator local_859;
  string local_858 [32];
  string local_838;
  ostringstream local_818 [8];
  ostringstream ss_e_3;
  int local_69c;
  Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> local_698;
  undefined1 local_670 [8];
  expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  undefined1 local_620 [8];
  optional<tinyusdz::Token> tok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [32];
  fmt local_590 [32];
  ostringstream local_570 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [32];
  fmt local_390 [32];
  ostringstream local_370 [8];
  ostringstream ss_e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  string *warn_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
  *result_local;
  Attribute *attr_local;
  EnumHandlerFun<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *enum_handler_local;
  bool strict_allowedToken_check_local;
  string *prop_name_local;
  
  if (result == (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                 *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar4 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x69b);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_1b8,"[Internal error] `result` arg is nullptr.");
    ::std::operator<<(poVar4,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::operator+(local_1d8,local_1f8);
      ::std::__cxx11::string::operator=((string *)err,(string *)local_1d8);
      ::std::__cxx11::string::~string((string *)local_1d8);
      ::std::__cxx11::string::~string((string *)local_1f8);
    }
    prop_name_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
    goto LAB_002f245b;
  }
  args_1 = result;
  psVar7 = warn;
  bVar1 = Attribute::is_connection(attr);
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_370);
    poVar4 = ::std::operator<<((ostream *)local_370,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x69f);
    ::std::operator<<(poVar4," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_3b0,
               "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}"
               ,&local_3b1);
    fmt::format<std::__cxx11::string>
              (local_390,(string *)local_3b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_name);
    poVar4 = ::std::operator<<((ostream *)local_370,(string *)local_390);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::~string((string *)local_390);
    ::std::__cxx11::string::~string(local_3b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::operator+(local_3d8,local_3f8);
      ::std::__cxx11::string::operator=((string *)err,(string *)local_3d8);
      ::std::__cxx11::string::~string((string *)local_3d8);
      ::std::__cxx11::string::~string((string *)local_3f8);
    }
    prop_name_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_370);
    goto LAB_002f245b;
  }
  VVar3 = Attribute::variability(attr);
  if (VVar3 == Uniform) {
    bVar1 = Attribute::is_blocked(attr);
    if (bVar1) {
      TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
      ::set_blocked(result,true);
      prop_name_local._7_1_ = 1;
    }
    else {
      pPVar5 = Attribute::get_var(attr);
      bVar1 = primvar::PrimVar::is_timesamples(pPVar5);
      if (bVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_570);
        poVar4 = ::std::operator<<((ostream *)local_570,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6ac);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_5b0,
                   "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned."
                   ,&local_5b1);
        fmt::format<std::__cxx11::string>
                  (local_590,(string *)local_5b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_name);
        poVar4 = ::std::operator<<((ostream *)local_570,(string *)local_590);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)local_590);
        ::std::__cxx11::string::~string(local_5b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_5d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&tok.contained + 0x18));
          ::std::__cxx11::string::operator=((string *)err,(string *)local_5d8);
          ::std::__cxx11::string::~string((string *)local_5d8);
          ::std::__cxx11::string::~string((string *)((long)&tok.contained + 0x18));
        }
        prop_name_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_570);
      }
      else {
        Attribute::get_value<tinyusdz::Token>
                  ((optional<tinyusdz::Token> *)
                   &e.contained.
                    super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value,attr);
        nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                  ((optional<tinyusdz::Token> *)local_620,
                   (optional<tinyusdz::Token> *)
                   &e.contained.
                    super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                  ((optional<tinyusdz::Token> *)
                   &e.contained.
                    super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_620);
        if (bVar1) {
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                             ((optional<tinyusdz::Token> *)local_620);
          psVar7 = Token::str_abi_cxx11_(pvVar6);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_670,enum_handler,psVar7);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_670);
          if (bVar1) {
            pvVar8 = nonstd::expected_lite::
                     expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_670);
            Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Animatable
                      (&local_698,pvVar8);
            TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
            ::operator=(result,&local_698);
            Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::~Animatable(&local_698);
            prop_name_local._7_1_ = 1;
          }
          else if (strict_allowedToken_check) {
            ::std::__cxx11::ostringstream::ostringstream(local_818);
            poVar4 = ::std::operator<<((ostream *)local_818,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6b5);
            ::std::operator<<(poVar4," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_858,"Attribute `{}`: `{}` is not an allowed token.",&local_859);
            pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                               ((optional<tinyusdz::Token> *)local_620);
            psVar7 = Token::str_abi_cxx11_(pvVar6);
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_838,(fmt *)local_858,prop_name,psVar7,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar4 = ::std::operator<<((ostream *)local_818,(string *)&local_838);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::~string((string *)&local_838);
            ::std::__cxx11::string::~string(local_858);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_859);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_880,local_8a0);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_880);
              ::std::__cxx11::string::~string((string *)local_880);
              ::std::__cxx11::string::~string((string *)local_8a0);
            }
            prop_name_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_818);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_a18);
            poVar4 = ::std::operator<<((ostream *)local_a18,"[warn]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6b7);
            ::std::operator<<(poVar4," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_a58,"Attribute `{}`: `{}` is not an allowed token. Ignore it.",
                       &local_a59);
            pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                               ((optional<tinyusdz::Token> *)local_620);
            psVar7 = Token::str_abi_cxx11_(pvVar6);
            fmt::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_a38,(fmt *)local_a58,prop_name,psVar7,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar4 = ::std::operator<<((ostream *)local_a18,(string *)&local_a38);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::~string((string *)&local_a38);
            ::std::__cxx11::string::~string(local_a58);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_a59);
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_a80,local_aa0);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_a80);
              ::std::__cxx11::string::~string((string *)local_a80);
              ::std::__cxx11::string::~string((string *)local_aa0);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_a18);
            TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
            ::set_value_empty(result);
            prop_name_local._7_1_ = 1;
          }
          nonstd::expected_lite::
          expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_670);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_c18);
          poVar4 = ::std::operator<<((ostream *)local_c18,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6bc);
          ::std::operator<<(poVar4," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_c58,
                     "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                     ,&local_c59);
          Attribute::type_name_abi_cxx11_(&local_c80,attr);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_c38,(fmt *)local_c58,prop_name,&local_c80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar4 = ::std::operator<<((ostream *)local_c18,(string *)&local_c38);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::~string((string *)&local_c38);
          ::std::__cxx11::string::~string((string *)&local_c80);
          ::std::__cxx11::string::~string(local_c58);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c59);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_ca0,local_cc0);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_ca0);
            ::std::__cxx11::string::~string((string *)local_ca0);
            ::std::__cxx11::string::~string((string *)local_cc0);
          }
          prop_name_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_c18);
        }
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                  ((optional<tinyusdz::Token> *)local_620);
      }
    }
    goto LAB_002f245b;
  }
  bVar1 = false;
  Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Animatable
            ((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)
             ((long)&tok_1.contained + 0x18));
  animatable_value._ts._31_1_ = Attribute::is_blocked(attr);
  if ((bool)animatable_value._ts._31_1_) {
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
    ::set_blocked(result,true);
  }
  pPVar5 = Attribute::get_var(attr);
  bVar2 = primvar::PrimVar::has_default(pPVar5);
  if (bVar2) {
    Attribute::get_value<tinyusdz::Token>
              ((optional<tinyusdz::Token> *)
               &e_1.contained.
                super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value,attr);
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
              ((optional<tinyusdz::Token> *)local_d18,
               (optional<tinyusdz::Token> *)
               &e_1.contained.
                super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional
              ((optional<tinyusdz::Token> *)
               &e_1.contained.
                super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
    bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_d18);
    if (bVar2) {
      pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                         ((optional<tinyusdz::Token> *)local_d18);
      psVar11 = Token::str_abi_cxx11_(pvVar6);
      ::std::
      function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d68,enum_handler,psVar11);
      bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_d68);
      if (bVar2) {
        pvVar8 = nonstd::expected_lite::
                 expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_d68);
        Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::set_default
                  ((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)
                   ((long)&tok_1.contained + 0x18),pvVar8);
        animatable_value._ts._31_1_ = 1;
LAB_002f1757:
        bVar2 = false;
      }
      else {
        if (!strict_allowedToken_check) {
          ::std::__cxx11::ostringstream::ostringstream(local_10e0);
          poVar4 = ::std::operator<<((ostream *)local_10e0,"[warn]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6da);
          ::std::operator<<(poVar4," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1120,"Attribute `{}`: `{}` is not an allowed token. Ignore it.",
                     &local_1121);
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                             ((optional<tinyusdz::Token> *)local_d18);
          psVar11 = Token::str_abi_cxx11_(pvVar6);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_1100,(fmt *)local_1120,prop_name,psVar11,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar4 = ::std::operator<<((ostream *)local_10e0,(string *)&local_1100);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::~string((string *)&local_1100);
          ::std::__cxx11::string::~string(local_1120);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1121);
          if (warn != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1148,local_1168);
            ::std::__cxx11::string::operator=((string *)warn,(string *)local_1148);
            ::std::__cxx11::string::~string((string *)local_1148);
            ::std::__cxx11::string::~string((string *)local_1168);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_10e0);
          goto LAB_002f1757;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_ee0);
        poVar4 = ::std::operator<<((ostream *)local_ee0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6d8);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_f20,"Attribute `{}`: `{}` is not an allowed token.",&local_f21);
        pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                           ((optional<tinyusdz::Token> *)local_d18);
        psVar11 = Token::str_abi_cxx11_(pvVar6);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_f00,(fmt *)local_f20,prop_name,psVar11,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar4 = ::std::operator<<((ostream *)local_ee0,(string *)&local_f00);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_f00);
        ::std::__cxx11::string::~string(local_f20);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_f21);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_f48,local_f68);
          ::std::__cxx11::string::operator=((string *)err,(string *)local_f48);
          ::std::__cxx11::string::~string((string *)local_f48);
          ::std::__cxx11::string::~string((string *)local_f68);
        }
        prop_name_local._7_1_ = 0;
        bVar2 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_ee0);
      }
      nonstd::expected_lite::
      expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d68);
      if (!bVar2) {
        bVar2 = false;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_12e0);
      poVar4 = ::std::operator<<((ostream *)local_12e0,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6df);
      ::std::operator<<(poVar4," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1320,
                 "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                 ,&local_1321);
      Attribute::type_name_abi_cxx11_(&local_1348,attr);
      fmt::format<std::__cxx11::string,std::__cxx11::string>
                (&local_1300,(fmt *)local_1320,prop_name,&local_1348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      poVar4 = ::std::operator<<((ostream *)local_12e0,(string *)&local_1300);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::~string((string *)&local_1300);
      ::std::__cxx11::string::~string((string *)&local_1348);
      ::std::__cxx11::string::~string(local_1320);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1321);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_1368,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_1368);
        ::std::__cxx11::string::~string((string *)local_1368);
        ::std::__cxx11::string::~string((string *)&n);
      }
      prop_name_local._7_1_ = 0;
      bVar2 = true;
      ::std::__cxx11::ostringstream::~ostringstream(local_12e0);
    }
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional
              ((optional<tinyusdz::Token> *)local_d18);
    if (!bVar2) goto LAB_002f194c;
  }
  else {
LAB_002f194c:
    pPVar5 = Attribute::get_var(attr);
    bVar2 = primvar::PrimVar::has_timesamples(pPVar5);
    if (bVar2) {
      pPVar5 = Attribute::get_var(attr);
      i = primvar::PrimVar::num_timesamples(pPVar5);
      for (sample_time = 0.0; (ulong)sample_time < i; sample_time = (double)((long)sample_time + 1))
      {
        pv.contained = (storage_t<double>)tinyusdz::value::TimeCode::Default();
        pPVar5 = Attribute::get_var(attr);
        primvar::PrimVar::get_ts_time(&local_13c0,pPVar5,(size_t)sample_time);
        nonstd::optional_lite::optional<double>::optional<double,_0>
                  ((optional<double> *)local_13b0,&local_13c0);
        nonstd::optional_lite::optional<double>::~optional(&local_13c0);
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_13b0);
        if (bVar1) {
          psVar9 = (storage_t<double> *)
                   nonstd::optional_lite::optional<double>::value((optional<double> *)local_13b0);
          pv.contained = *psVar9;
          bVar1 = false;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1538);
          poVar4 = ::std::operator<<((ostream *)local_1538,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6ef);
          ::std::operator<<(poVar4," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1578,"Internal error. Failed to get timecode for `{}`",&local_1579);
          fmt::format<std::__cxx11::string>
                    (local_1558,(string *)local_1578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_name)
          ;
          poVar4 = ::std::operator<<((ostream *)local_1538,(string *)local_1558);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::~string((string *)local_1558);
          ::std::__cxx11::string::~string(local_1578);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1579);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_15a0,local_15c0);
            ::std::__cxx11::string::operator=((string *)err,(string *)local_15a0);
            ::std::__cxx11::string::~string((string *)local_15a0);
            ::std::__cxx11::string::~string((string *)local_15c0);
          }
          prop_name_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_1538);
        }
        nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_13b0);
        if (bVar1) goto LAB_002f2449;
        pPVar5 = Attribute::get_var(attr);
        primvar::PrimVar::is_ts_value_blocked((PrimVar *)local_15c4,(size_t)pPVar5);
        nonstd::optional_lite::optional<bool>::optional<bool,_0>
                  ((optional<bool> *)(local_15c4 + 2),(optional<bool> *)local_15c4);
        nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)local_15c4);
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(local_15c4 + 2))
        ;
        if (bVar1) {
          pvVar10 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(local_15c4 + 2))
          ;
          if ((*pvVar10 & 1U) == 1) {
            Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::add_blocked_sample
                      ((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)
                       ((long)&tok_1.contained + 0x18),(double)pv.contained);
            local_69c = 0x16;
          }
          else {
            local_69c = 0;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1740);
          poVar4 = ::std::operator<<((ostream *)local_1740,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x6f9);
          ::std::operator<<(poVar4," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1780,"Internal error. Failed to get valueblock info for `{}`",&local_1781
                    );
          fmt::format<std::__cxx11::string>
                    (local_1760,(string *)local_1780,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_name)
          ;
          poVar4 = ::std::operator<<((ostream *)local_1740,(string *)local_1760);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::~string((string *)local_1760);
          ::std::__cxx11::string::~string(local_1780);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1781);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_17a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&tok_2.contained + 0x18));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_17a8);
            ::std::__cxx11::string::~string((string *)local_17a8);
            ::std::__cxx11::string::~string((string *)((long)&tok_2.contained + 0x18));
          }
          prop_name_local._7_1_ = 0;
          local_69c = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1740);
        }
        nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)(local_15c4 + 2));
        if (local_69c == 0) {
          pPVar5 = Attribute::get_var(attr);
          primvar::PrimVar::get_ts_value<tinyusdz::Token>
                    ((optional<tinyusdz::Token> *)
                     &e_2.contained.
                      super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,pPVar5,(size_t)sample_time);
          nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                    ((optional<tinyusdz::Token> *)local_17f0,
                     (optional<tinyusdz::Token> *)
                     &e_2.contained.
                      super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                    ((optional<tinyusdz::Token> *)
                     &e_2.contained.
                      super_storage_t_impl<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_17f0);
          if (bVar1) {
            pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                               ((optional<tinyusdz::Token> *)local_17f0);
            psVar11 = Token::str_abi_cxx11_(pvVar6);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1840,enum_handler,psVar11);
            bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_1840);
            t = pv.contained;
            if (bVar1) {
              pvVar8 = nonstd::expected_lite::
                       expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1840);
              Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::add_sample
                        ((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)
                         ((long)&tok_1.contained + 0x18),(double)t,pvVar8);
              local_69c = 0;
            }
            else if (strict_allowedToken_check) {
              ::std::__cxx11::ostringstream::ostringstream(local_19b8);
              poVar4 = ::std::operator<<((ostream *)local_19b8,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x701);
              ::std::operator<<(poVar4," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_19f8,"Attribute `{}`: `{}` is not an allowed token.",&local_19f9);
              pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                 ((optional<tinyusdz::Token> *)local_17f0);
              psVar11 = Token::str_abi_cxx11_(pvVar6);
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_19d8,(fmt *)local_19f8,prop_name,psVar11,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar4 = ::std::operator<<((ostream *)local_19b8,(string *)&local_19d8);
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::string::~string((string *)&local_19d8);
              ::std::__cxx11::string::~string(local_19f8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_19f9);
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1a20,local_1a40);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_1a20);
                ::std::__cxx11::string::~string((string *)local_1a20);
                ::std::__cxx11::string::~string((string *)local_1a40);
              }
              prop_name_local._7_1_ = 0;
              local_69c = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_19b8);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1bb8);
              poVar4 = ::std::operator<<((ostream *)local_1bb8,"[warn]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x703);
              ::std::operator<<(poVar4," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1bf8,
                         "Attribute `{}`: `{}` at {}\'th timesample is not an allowed token. Ignore it."
                         ,&local_1bf9);
              pvVar6 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                 ((optional<tinyusdz::Token> *)local_17f0);
              args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                        *)Token::str_abi_cxx11_(pvVar6);
              fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                        (&local_1bd8,(fmt *)local_1bf8,prop_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &sample_time,(unsigned_long *)args_1,psVar7);
              poVar4 = ::std::operator<<((ostream *)local_1bb8,(string *)&local_1bd8);
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::string::~string((string *)&local_1bd8);
              ::std::__cxx11::string::~string(local_1bf8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1bf9);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1c20,local_1c40);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_1c20);
                ::std::__cxx11::string::~string((string *)local_1c20);
                ::std::__cxx11::string::~string((string *)local_1c40);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1bb8);
              local_69c = 0x16;
            }
            nonstd::expected_lite::
            expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~expected((expected<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_1840);
            if (local_69c == 0) {
              local_69c = 0;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1db8);
            poVar4 = ::std::operator<<((ostream *)local_1db8,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ParseTimeSampledEnumProperty");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x707);
            ::std::operator<<(poVar4," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1df8,
                       "Internal error. Maybe type mismatch? Attribute `{}`\'s {}\'th timesample must be type `token`, but got type `{}`"
                       ,(allocator *)(local_1e20 + 0x27));
            Attribute::type_name_abi_cxx11_((string *)local_1e20,attr);
            args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
                      *)local_1e20;
            fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                      (&local_1dd8,(fmt *)local_1df8,prop_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sample_time,(unsigned_long *)args_1,psVar7);
            poVar4 = ::std::operator<<((ostream *)local_1db8,(string *)&local_1dd8);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::~string((string *)&local_1dd8);
            ::std::__cxx11::string::~string((string *)local_1e20);
            ::std::__cxx11::string::~string(local_1df8);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_1e20 + 0x27));
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1e40,local_1e60);
              ::std::__cxx11::string::operator=((string *)err,(string *)local_1e40);
              ::std::__cxx11::string::~string((string *)local_1e40);
              ::std::__cxx11::string::~string((string *)local_1e60);
            }
            prop_name_local._7_1_ = 0;
            local_69c = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1db8);
          }
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                    ((optional<tinyusdz::Token> *)local_17f0);
          if (local_69c != 0) goto joined_r0x002f23f5;
        }
        else {
joined_r0x002f23f5:
          if (local_69c != 0x16) goto LAB_002f2449;
        }
      }
      bVar1 = true;
    }
    if ((animatable_value._ts._31_1_ != '\0') || (bVar1)) {
      TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
      ::set_value(result,(Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)
                         ((long)&tok_1.contained + 0x18));
    }
    prop_name_local._7_1_ = 1;
  }
LAB_002f2449:
  Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::~Animatable
            ((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)
             ((long)&tok_1.contained + 0x18));
LAB_002f245b:
  return (bool)(prop_name_local._7_1_ & 1);
}

Assistant:

bool ParseTimeSampledEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<Animatable<T>> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // default and/or TimeSamples
    bool has_default{false};
    bool has_timesamples{false};

    Animatable<T> animatable_value;

    if (attr.is_blocked()) {
      result->set_blocked(true);
      has_default = true;
      //return true;
    }

    if (attr.get_var().has_default()) {
      DCOUT("has default.");

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          animatable_value.set_default(e.value());
          has_default = true;
          //return true;

        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          //result->set_value_empty();
          //return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    }

    if (attr.get_var().has_timesamples()) {
      DCOUT("has timesamples.");
      size_t n = attr.get_var().num_timesamples();

      for (size_t i = 0; i < n; i++) {

        double sample_time{value::TimeCode::Default()};

        if (auto pv = attr.get_var().get_ts_time(i)) {
          sample_time = pv.value();
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get timecode for `{}`", prop_name);
        }

        if (auto pv = attr.get_var().is_ts_value_blocked(i)) {
          if (pv.value() == true) {
            animatable_value.add_blocked_sample(sample_time);
            continue;
          }
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get valueblock info for `{}`", prop_name);
        }

        if (auto tok = attr.get_var().get_ts_value<value::token>(i)) {
          auto e = enum_handler(tok.value().str());
          if (e) {
            animatable_value.add_sample(sample_time, e.value());
          } else if (strict_allowedToken_check) {
            PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
          } else {
            PUSH_WARN_F("Attribute `{}`: `{}` at {}'th timesample is not an allowed token. Ignore it.", prop_name, i, tok.value().str());
            continue;
          }
        } else {
          PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}`'s {}'th timesample must be type `token`, but got type `{}`", prop_name, i, attr.type_name());
        }
      }

      has_timesamples = true;
      //return true;

    }

    if (has_default || has_timesamples) {
      result->set_value(animatable_value);
    }

    return true;

  }

  return false;
}